

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NetworkUpdateParameters::clear_seed(NetworkUpdateParameters *this)

{
  ulong uVar1;
  Int64Parameter *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) && (this_00 = this->seed_, this_00 != (Int64Parameter *)0x0)) {
    Int64Parameter::~Int64Parameter(this_00);
    operator_delete(this_00,0x28);
  }
  this->seed_ = (Int64Parameter *)0x0;
  return;
}

Assistant:

void NetworkUpdateParameters::clear_seed() {
  if (GetArenaForAllocation() == nullptr && seed_ != nullptr) {
    delete seed_;
  }
  seed_ = nullptr;
}